

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_has_any_or_all.cpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::ListHasAnyOrAllBind
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  vector<duckdb::LogicalType,_true> *this_00;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  reference pvVar6;
  pointer pEVar7;
  pointer pEVar8;
  reference pvVar9;
  LogicalType *pLVar10;
  LogicalType *pLVar11;
  ParameterNotResolvedException *this_01;
  BinderException *this_02;
  allocator local_e9;
  undefined1 local_e8 [32];
  undefined1 local_c8 [16];
  LogicalType common_child;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pvVar6 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::get<true>(arguments,0);
  local_c8._8_8_ =
       (pvVar6->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t
       .super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (pvVar6->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
  BoundCastExpression::AddArrayCastToList
            ((BoundCastExpression *)local_e8,context,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             (local_c8 + 8));
  pvVar6 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::get<true>(arguments,0);
  uVar2 = local_e8._0_8_;
  local_e8._0_8_ = (_func_int **)0x0;
  _Var1._M_head_impl =
       (pvVar6->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t
       .super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (pvVar6->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)uVar2;
  if (_Var1._M_head_impl != (Expression *)0x0) {
    (**(code **)(*(long *)&(_Var1._M_head_impl)->super_BaseExpression + 8))();
  }
  if ((_func_int **)local_e8._0_8_ != (_func_int **)0x0) {
    (**(code **)(*(_func_int **)local_e8._0_8_ + 8))();
  }
  local_e8._0_8_ = (Expression *)0x0;
  if ((Expression *)local_c8._8_8_ != (Expression *)0x0) {
    (**(code **)(*(long *)local_c8._8_8_ + 8))();
  }
  local_c8._8_8_ = 0;
  pvVar6 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::get<true>(arguments,1);
  local_c8._0_8_ =
       (pvVar6->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t
       .super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (pvVar6->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
  BoundCastExpression::AddArrayCastToList
            ((BoundCastExpression *)local_e8,context,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             local_c8);
  pvVar6 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::get<true>(arguments,1);
  uVar2 = local_e8._0_8_;
  local_e8._0_8_ = (_func_int **)0x0;
  _Var1._M_head_impl =
       (pvVar6->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t
       .super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (pvVar6->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)uVar2;
  if (_Var1._M_head_impl != (Expression *)0x0) {
    (**(code **)(*(long *)&(_Var1._M_head_impl)->super_BaseExpression + 8))();
  }
  if ((_func_int **)local_e8._0_8_ != (_func_int **)0x0) {
    (**(code **)(*(_func_int **)local_e8._0_8_ + 8))();
  }
  local_e8._0_8_ = (_func_int **)0x0;
  if ((Expression *)local_c8._0_8_ != (Expression *)0x0) {
    (**(code **)(*(long *)local_c8._0_8_ + 8))();
  }
  local_c8._0_8_ = 0;
  pvVar6 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::get<true>(arguments,0);
  pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar6);
  iVar4 = (*(pEVar7->super_BaseExpression)._vptr_BaseExpression[6])(pEVar7);
  pvVar6 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::get<true>(arguments,1);
  pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar6);
  iVar5 = (*(pEVar7->super_BaseExpression)._vptr_BaseExpression[6])(pEVar7);
  if ((byte)((byte)iVar4 & (byte)iVar5) == 1) {
    this_01 = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
    ParameterNotResolvedException::ParameterNotResolvedException(this_01);
    __cxa_throw(this_01,&ParameterNotResolvedException::typeinfo,
                ::std::runtime_error::~runtime_error);
  }
  pvVar6 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::get<true>(arguments,0);
  pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar6);
  pvVar6 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::get<true>(arguments,1);
  pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar6);
  pLVar10 = &pEVar8->return_type;
  this_00 = &(bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments;
  pvVar9 = vector<duckdb::LogicalType,_true>::get<true>(this_00,0);
  if ((byte)iVar4 == 0) {
    pLVar11 = &pEVar7->return_type;
    LogicalType::operator=(pvVar9,pLVar11);
    pvVar9 = vector<duckdb::LogicalType,_true>::get<true>(this_00,1);
    if ((byte)iVar5 == 0) {
      LogicalType::operator=(pvVar9,pLVar10);
      pvVar9 = vector<duckdb::LogicalType,_true>::get<true>(this_00,0);
      pLVar10 = ListType::GetChildType(pvVar9);
      pvVar9 = vector<duckdb::LogicalType,_true>::get<true>(this_00,1);
      pLVar11 = ListType::GetChildType(pvVar9);
      LogicalType::LogicalType((LogicalType *)local_e8,SQLNULL);
      bVar3 = LogicalType::operator!=(pLVar10,(LogicalType *)local_e8);
      if (bVar3) {
        LogicalType::LogicalType(&common_child,SQLNULL);
        bVar3 = LogicalType::operator!=(pLVar11,&common_child);
        if (!bVar3) {
          LogicalType::~LogicalType(&common_child);
          goto LAB_01d0693f;
        }
        bVar3 = LogicalType::operator!=(pLVar10,pLVar11);
        LogicalType::~LogicalType(&common_child);
        LogicalType::~LogicalType((LogicalType *)local_e8);
        if (!bVar3) goto LAB_01d06949;
        LogicalType::LogicalType(&common_child);
        bVar3 = LogicalType::TryGetMaxLogicalType(context,pLVar10,pLVar11,&common_child);
        if (!bVar3) {
          this_02 = (BinderException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)local_e8,
                     "\'%s\' cannot compare lists of different types: \'%s\' and \'%s\'",&local_e9);
          ::std::__cxx11::string::string
                    ((string *)&local_50,
                     (string *)
                     &(bound_function->super_BaseScalarFunction).super_SimpleFunction.super_Function
                      .name);
          LogicalType::ToString_abi_cxx11_(&local_70,pLVar10);
          LogicalType::ToString_abi_cxx11_(&local_90,pLVar11);
          BinderException::
          BinderException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                    (this_02,(string *)local_e8,&local_50,&local_70,&local_90);
          __cxa_throw(this_02,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        LogicalType::LIST((LogicalType *)local_e8,&common_child);
        pvVar9 = vector<duckdb::LogicalType,_true>::get<true>(this_00,0);
        LogicalType::operator=(pvVar9,(LogicalType *)local_e8);
        LogicalType::~LogicalType((LogicalType *)local_e8);
        LogicalType::LIST((LogicalType *)local_e8,&common_child);
        pvVar9 = vector<duckdb::LogicalType,_true>::get<true>(this_00,1);
        LogicalType::operator=(pvVar9,(LogicalType *)local_e8);
        LogicalType::~LogicalType((LogicalType *)local_e8);
        pLVar10 = &common_child;
      }
      else {
LAB_01d0693f:
        pLVar10 = (LogicalType *)local_e8;
      }
      LogicalType::~LogicalType(pLVar10);
      goto LAB_01d06949;
    }
  }
  else {
    LogicalType::operator=(pvVar9,pLVar10);
    pvVar9 = vector<duckdb::LogicalType,_true>::get<true>(this_00,1);
    pLVar11 = pLVar10;
  }
  LogicalType::operator=(pvVar9,pLVar11);
LAB_01d06949:
  *(undefined8 *)this = 0;
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

static unique_ptr<FunctionData> ListHasAnyOrAllBind(ClientContext &context, ScalarFunction &bound_function,
                                                    vector<unique_ptr<Expression>> &arguments) {

	arguments[0] = BoundCastExpression::AddArrayCastToList(context, std::move(arguments[0]));
	arguments[1] = BoundCastExpression::AddArrayCastToList(context, std::move(arguments[1]));

	const auto lhs_is_param = arguments[0]->HasParameter();
	const auto rhs_is_param = arguments[1]->HasParameter();

	if (lhs_is_param && rhs_is_param) {
		throw ParameterNotResolvedException();
	}

	const auto &lhs_list = arguments[0]->return_type;
	const auto &rhs_list = arguments[1]->return_type;

	if (lhs_is_param) {
		bound_function.arguments[0] = rhs_list;
		bound_function.arguments[1] = rhs_list;
		return nullptr;
	}
	if (rhs_is_param) {
		bound_function.arguments[0] = lhs_list;
		bound_function.arguments[1] = lhs_list;
		return nullptr;
	}

	bound_function.arguments[0] = lhs_list;
	bound_function.arguments[1] = rhs_list;

	const auto &lhs_child = ListType::GetChildType(bound_function.arguments[0]);
	const auto &rhs_child = ListType::GetChildType(bound_function.arguments[1]);

	if (lhs_child != LogicalType::SQLNULL && rhs_child != LogicalType::SQLNULL && lhs_child != rhs_child) {
		LogicalType common_child;
		if (!LogicalType::TryGetMaxLogicalType(context, lhs_child, rhs_child, common_child)) {
			throw BinderException("'%s' cannot compare lists of different types: '%s' and '%s'", bound_function.name,
			                      lhs_child.ToString(), rhs_child.ToString());
		}
		bound_function.arguments[0] = LogicalType::LIST(common_child);
		bound_function.arguments[1] = LogicalType::LIST(common_child);
	}

	return nullptr;
}